

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t address)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  undefined7 in_register_00000009;
  ctrl_t *pcVar4;
  _List_node_base *p_Var5;
  size_t *psVar6;
  undefined3 in_register_00000081;
  iterator iVar7;
  iterator iVar8;
  list<unsigned_long,_std::allocator<unsigned_long>_> stack1;
  _List_node_base local_360;
  ulong local_350;
  _List_node_base local_348;
  ulong local_338;
  uint32_t local_330;
  undefined4 local_32c;
  uint32_t local_328;
  undefined4 local_324;
  VarState *local_320;
  anon_union_8_1_a8a14541_for_iterator_1 local_318;
  undefined1 local_310;
  undefined1 local_30f;
  uint32_t local_30c;
  undefined4 local_308;
  ulong local_300;
  ulong local_2f8;
  undefined8 local_2f0;
  size_t local_2e8;
  undefined8 local_2e0;
  size_t local_2d8 [16];
  undefined1 local_258;
  undefined1 local_257;
  uint32_t local_254;
  undefined4 local_250;
  ulong local_248;
  ulong local_240;
  undefined8 local_238;
  size_t local_230;
  undefined8 local_228;
  size_t local_220 [16];
  undefined1 local_1a0 [16];
  ulong local_190;
  undefined1 local_e8 [184];
  
  local_324 = CONCAT31(in_register_00000081,wr2);
  local_32c = (undefined4)CONCAT71(in_register_00000009,wr1);
  local_1a0._0_8_ = CONCAT44(0,thr1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1a0._0_8_;
  local_330 = thr1;
  local_320 = var;
  iVar7 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_1a0,
                     SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
  local_318 = iVar7.field_1;
  local_1a0._0_8_ = CONCAT44(0,thr2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1a0._0_8_;
  local_328 = thr2;
  iVar8 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_1a0,
                     SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0));
  pcVar4 = (this->threads).
           super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .
           super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .ctrl_ + (this->threads).
                    super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .
                    super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .capacity_;
  if ((iVar7.ctrl_ != pcVar4) && (iVar8.ctrl_ != pcVar4)) {
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,
               (StackTrace *)(*(long *)((long)local_318.slot_ + 8) + 0x38),address);
    local_348._M_next = (_List_node_base *)local_1a0._0_8_;
    local_348._M_prev = (_List_node_base *)local_1a0._8_8_;
    local_338 = local_190;
    p_Var5 = &local_348;
    p_Var3 = &local_348;
    if ((_List_node_base *)local_1a0._0_8_ != (_List_node_base *)local_1a0) {
      (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0._8_8_)->_M_impl).
      _M_node.super__List_node_base._M_next = &local_348;
      *(_List_node_base **)(local_1a0._0_8_ + 8) = &local_348;
      p_Var5 = local_348._M_next;
      p_Var3 = local_348._M_prev;
    }
    local_348._M_prev = p_Var3;
    local_348._M_next = p_Var5;
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,
               (StackTrace *)(*(long *)((long)iVar8.field_1.slot_ + 8) + 0x38),address);
    local_350 = local_190;
    p_Var5 = local_348._M_next;
    if ((_List_node_base *)local_1a0._0_8_ == (_List_node_base *)local_1a0) {
      local_360._M_next = &local_360;
      local_360._M_prev = local_360._M_next;
    }
    else {
      (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0._8_8_)->_M_impl).
      _M_node.super__List_node_base._M_next = &local_360;
      *(_List_node_base **)(local_1a0._0_8_ + 8) = &local_360;
      local_360._M_next = (_List_node_base *)local_1a0._0_8_;
      local_360._M_prev = (_List_node_base *)local_1a0._8_8_;
    }
    while (p_Var3 = local_360._M_next, local_348._M_next = p_Var5, 0x10 < local_338) {
      local_338 = local_338 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
      p_Var5 = local_348._M_next;
    }
    while (local_360._M_next = p_Var3, 0x10 < local_350) {
      local_350 = local_350 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var3,0x18);
      p_Var3 = local_360._M_next;
    }
    local_220[0xe] = 0;
    local_220[0xf] = 0;
    local_220[0xc] = 0;
    local_220[0xd] = 0;
    local_220[10] = 0;
    local_220[0xb] = 0;
    local_220[8] = 0;
    local_220[9] = 0;
    local_220[6] = 0;
    local_220[7] = 0;
    local_220[4] = 0;
    local_220[5] = 0;
    local_220[2] = 0;
    local_220[3] = 0;
    local_220[0] = 0;
    local_220[1] = 0;
    local_258 = (undefined1)local_32c;
    local_230 = address;
    local_2f8 = (ulong)local_320->size;
    local_250 = 0;
    local_228 = 0;
    local_238 = 0;
    local_257 = 0;
    if (local_348._M_next != &local_348) {
      psVar6 = local_220;
      p_Var5 = local_348._M_next;
      do {
        *psVar6 = (size_t)p_Var5[1]._M_next;
        psVar6 = psVar6 + 1;
        p_Var5 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var5 != &local_348);
    }
    local_2d8[0xe] = 0;
    local_2d8[0xf] = 0;
    local_2d8[0xc] = 0;
    local_2d8[0xd] = 0;
    local_2d8[10] = 0;
    local_2d8[0xb] = 0;
    local_2d8[8] = 0;
    local_2d8[9] = 0;
    local_2d8[6] = 0;
    local_2d8[7] = 0;
    local_2d8[4] = 0;
    local_2d8[5] = 0;
    local_2d8[2] = 0;
    local_2d8[3] = 0;
    local_2d8[0] = 0;
    local_2d8[1] = 0;
    local_310 = (undefined1)local_324;
    local_2e8 = address;
    local_308 = 0;
    local_2e0 = 0;
    local_2f0 = 0;
    local_30f = 0;
    local_254 = local_330;
    local_248 = local_338;
    local_240 = local_2f8;
    if (p_Var3 != &local_360) {
      psVar6 = local_2d8;
      do {
        *psVar6 = (size_t)p_Var3[1]._M_next;
        psVar6 = psVar6 + 1;
        p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var3 != &local_360);
    }
    local_30c = local_328;
    local_300 = local_350;
    memcpy((Race *)local_1a0,&local_258,0xb8);
    memcpy(local_e8,&local_310,0xb8);
    (*this->clb)((Race *)local_1a0,this->clb_context);
    p_Var5 = local_360._M_next;
    while (p_Var3 = local_348._M_next, p_Var5 != &local_360) {
      p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var3;
    }
    while (p_Var3 != &local_348) {
      p_Var5 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var5;
    }
  }
  return;
}

Assistant:

void report_race(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                   const VarState& var, size_t address) const {
    auto it = threads.find(thr1);
    auto it2 = threads.find(thr2);
    auto it_end = threads.end();

    if (it == it_end ||
        it2 == it_end) {  // if thread_id is, because of finishing, not in stack
                          // traces anymore, return
      return;
    }
    std::list<size_t> stack1(
        std::move(it->second->get_stackDepot().return_stack_trace(address)));
    std::list<size_t> stack2(
        std::move(it2->second->get_stackDepot().return_stack_trace(address)));

    while (stack1.size() > Detector::max_stack_size) {
      stack1.pop_front();
    }
    while (stack2.size() > Detector::max_stack_size) {
      stack2.pop_front();
    }

    Detector::AccessEntry access1;
    access1.thread_id = thr1;
    access1.write = wr1;
    access1.accessed_memory = address;
    access1.access_size = var.size;
    access1.access_type = 0;
    access1.heap_block_begin = 0;
    access1.heap_block_size = 0;
    access1.onheap = false;
    access1.stack_size = stack1.size();
    std::copy(stack1.begin(), stack1.end(), access1.stack_trace.begin());

    Detector::AccessEntry access2;
    access2.thread_id = thr2;
    access2.write = wr2;
    access2.accessed_memory = address;
    access2.access_size = var.size;
    access2.access_type = 0;
    access2.heap_block_begin = 0;
    access2.heap_block_size = 0;
    access2.onheap = false;
    access2.stack_size = stack2.size();
    std::copy(stack2.begin(), stack2.end(), access2.stack_trace.begin());

    Detector::Race race;
    race.first = access1;
    race.second = access2;

    clb(&race, clb_context);
  }